

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

int png_check_fp_number(png_const_charp string,png_size_t size,int *statep,png_size_tp whereami)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar4;
  byte bVar5;
  undefined2 uVar6;
  undefined8 *puVar7;
  undefined1 *puVar8;
  ulong *puVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  png_size_t pVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  ulong uStack_38;
  
  puVar7 = (undefined8 *)&stack0xffffffffffffffd0;
  puVar8 = &stack0xffffffffffffffd0;
  uVar11 = *whereami;
  pVar13 = size;
  if (size < uVar11) {
    pVar13 = uVar11;
  }
  uVar2 = *statep;
  for (; UNRECOVERED_JUMPTABLE = (code *)(ulong)uVar2, uVar12 = pVar13, uVar11 < size;
      uVar11 = uVar11 + 1) {
    uVar14 = 4;
    uVar12 = uVar11;
    switch(string[uVar11]) {
    case '+':
      break;
    case ',':
    case '/':
    case ':':
    case ';':
    case '<':
    case '=':
    case '>':
    case '?':
    case '@':
    case 'A':
    case 'B':
    case 'C':
    case 'D':
      goto switchD_00277859_caseD_2c;
    case '-':
      uVar14 = 0x84;
      break;
    case '.':
      uVar14 = 0x10;
      break;
    case '0':
      uVar14 = 8;
      break;
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      uVar14 = 0x108;
      break;
    case 'E':
      goto switchD_00277859_caseD_45;
    default:
      if (string[uVar11] != 'e') goto switchD_00277859_caseD_2c;
switchD_00277859_caseD_45:
      uVar14 = 0x20;
    }
    uVar10 = uVar2 & 3;
    uVar15 = ((uVar14 & 0x3c) - 4) + uVar10;
    if (uVar15 < 0xd) {
      lVar16 = (long)*(int *)(&DAT_002ed29c + (ulong)uVar15 * 4);
      uVar6 = SUB82(statep,0);
      switch(uVar15) {
      case 0:
        *(uint *)UNRECOVERED_JUMPTABLE = *(int *)UNRECOVERED_JUMPTABLE + uVar2;
        if ((POPCOUNT(*(uint *)UNRECOVERED_JUMPTABLE & 0xff) & 1U) == 0) {
          while( true ) {
            uVar2 = (uint)*whereami;
            bVar5 = (char)statep + (char)uVar2;
            statep = (int *)(ulong)bVar5;
            if ((POPCOUNT(bVar5) & 1U) != 0) break;
            puVar9 = (ulong *)(puVar8 + -8);
            puVar8 = puVar8 + -8;
            *puVar9 = (ulong)uVar2;
            pVar13 = *whereami;
            pcVar4 = (char *)(ulong)(uint)pVar13;
            cVar1 = *pcVar4;
            *pcVar4 = *pcVar4 + -0x2e;
            if (SCARRY1(cVar1,-0x2e) == *pcVar4 < '\0') {
              iVar3 = (**(code **)pcVar4)();
              return iVar3;
            }
            out(0xff,(uint)pVar13);
            pcVar4 = (char *)((long)&UINT_002ed280 + (long)string * 2 + 3);
            *pcVar4 = *pcVar4 + (byte)whereami;
          }
        }
        else {
          out(0xff,uVar2);
          bRam000000007a8ed29d = bRam000000007a8ed29d ^ (byte)whereami;
        }
        out(0xff,uVar2);
        halt_baddata();
      case 1:
        out(uVar6,uVar2);
        *(int *)(UNRECOVERED_JUMPTABLE + 0x54000468) =
             *(int *)(UNRECOVERED_JUMPTABLE + 0x54000468) + -1;
        out(uVar6,uVar2);
        *(int *)(UNRECOVERED_JUMPTABLE + -0x51fffb98) =
             *(int *)(UNRECOVERED_JUMPTABLE + -0x51fffb98) + 1;
        out(uVar6,uVar2);
        *(undefined8 *)((ulong)((int)uRam000000005bd30004 - 1) - 8) = 0x5caf0004;
        out(uVar6,uVar2);
        iVar3 = (*UNRECOVERED_JUMPTABLE)();
        return iVar3;
      case 3:
        while( true ) {
          out(0xd9,(char)UNRECOVERED_JUMPTABLE);
          pcVar4 = string + -0x757cc0f3;
          cVar1 = *pcVar4;
          *pcVar4 = *pcVar4 << 1;
          bVar19 = cVar1 < '\0' != *pcVar4 < '\0';
          bVar18 = *pcVar4 < '\0';
          bVar17 = *pcVar4 != '\0';
          if (bVar17 && bVar19 == bVar18) {
            halt_baddata();
          }
          in((short)statep);
          if (bVar17 && bVar19 == bVar18) break;
          statep = (int *)*puVar7;
          puVar7 = puVar7 + 1;
          if (bVar17 && bVar19 == bVar18) {
            halt_baddata();
          }
          UNRECOVERED_JUMPTABLE = (code *)(ulong)uRam23c0fdde62ebd08d;
          out((short)statep,uRam23c0fdde62ebd08d);
        }
        return *(int *)size;
      }
      bVar5 = (byte)((ulong)whereami >> 8);
      if (lVar16 != -0x2ed29c) {
        *(char *)((long)whereami + 0x54) = *(char *)((long)whereami + 0x54) + bVar5;
        out(*(undefined4 *)size,uVar6);
        halt_baddata();
      }
      out(uRam00000000fcd794e2,uVar6);
      if (lVar16 == -0x2ed29c) {
        if (-1 < (long)(&DAT_002ed29c + lVar16)) {
          halt_baddata();
        }
        UNRECOVERED_JUMPTABLE[0x43] =
             (code)((char)UNRECOVERED_JUMPTABLE[0x43] + (char)((ulong)statep >> 8));
        halt_baddata();
      }
      string[(ulong)uVar10 * 2 + 99] = string[(ulong)uVar10 * 2 + 99] & bVar5;
      halt_baddata();
    }
    uVar10 = uVar14 & 0x3c | uVar10;
    if (((uVar10 != 0x20) && (uVar10 != 0x21)) || ((uVar2 & 8) == 0)) break;
    uVar2 = uVar2 & 0x1c0 | 2;
  }
switchD_00277859_caseD_2c:
  *statep = uVar2;
  *whereami = uVar12;
  return uVar2 >> 3 & 1;
}

Assistant:

int /* PRIVATE */
png_check_fp_number(png_const_charp string, png_size_t size, int *statep,
    png_size_tp whereami)
{
   int state = *statep;
   png_size_t i = *whereami;

   while (i < size)
   {
      int type;
      /* First find the type of the next character */
      switch (string[i])
      {
      case 43:  type = PNG_FP_SAW_SIGN;                   break;
      case 45:  type = PNG_FP_SAW_SIGN + PNG_FP_NEGATIVE; break;
      case 46:  type = PNG_FP_SAW_DOT;                    break;
      case 48:  type = PNG_FP_SAW_DIGIT;                  break;
      case 49: case 50: case 51: case 52:
      case 53: case 54: case 55: case 56:
      case 57:  type = PNG_FP_SAW_DIGIT + PNG_FP_NONZERO; break;
      case 69:
      case 101: type = PNG_FP_SAW_E;                      break;
      default:  goto PNG_FP_End;
      }

      /* Now deal with this type according to the current
       * state, the type is arranged to not overlap the
       * bits of the PNG_FP_STATE.
       */
      switch ((state & PNG_FP_STATE) + (type & PNG_FP_SAW_ANY))
      {
      case PNG_FP_INTEGER + PNG_FP_SAW_SIGN:
         if ((state & PNG_FP_SAW_ANY) != 0)
            goto PNG_FP_End; /* not a part of the number */

         png_fp_add(state, type);
         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_DOT:
         /* Ok as trailer, ok as lead of fraction. */
         if ((state & PNG_FP_SAW_DOT) != 0) /* two dots */
            goto PNG_FP_End;

         else if ((state & PNG_FP_SAW_DIGIT) != 0) /* trailing dot? */
            png_fp_add(state, type);

         else
            png_fp_set(state, PNG_FP_FRACTION | type);

         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_DIGIT:
         if ((state & PNG_FP_SAW_DOT) != 0) /* delayed fraction */
            png_fp_set(state, PNG_FP_FRACTION | PNG_FP_SAW_DOT);

         png_fp_add(state, type | PNG_FP_WAS_VALID);

         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_E:
         if ((state & PNG_FP_SAW_DIGIT) == 0)
            goto PNG_FP_End;

         png_fp_set(state, PNG_FP_EXPONENT);

         break;

   /* case PNG_FP_FRACTION + PNG_FP_SAW_SIGN:
         goto PNG_FP_End; ** no sign in fraction */

   /* case PNG_FP_FRACTION + PNG_FP_SAW_DOT:
         goto PNG_FP_End; ** Because SAW_DOT is always set */

      case PNG_FP_FRACTION + PNG_FP_SAW_DIGIT:
         png_fp_add(state, type | PNG_FP_WAS_VALID);
         break;

      case PNG_FP_FRACTION + PNG_FP_SAW_E:
         /* This is correct because the trailing '.' on an
          * integer is handled above - so we can only get here
          * with the sequence ".E" (with no preceding digits).
          */
         if ((state & PNG_FP_SAW_DIGIT) == 0)
            goto PNG_FP_End;

         png_fp_set(state, PNG_FP_EXPONENT);

         break;

      case PNG_FP_EXPONENT + PNG_FP_SAW_SIGN:
         if ((state & PNG_FP_SAW_ANY) != 0)
            goto PNG_FP_End; /* not a part of the number */

         png_fp_add(state, PNG_FP_SAW_SIGN);

         break;

   /* case PNG_FP_EXPONENT + PNG_FP_SAW_DOT:
         goto PNG_FP_End; */

      case PNG_FP_EXPONENT + PNG_FP_SAW_DIGIT:
         png_fp_add(state, PNG_FP_SAW_DIGIT | PNG_FP_WAS_VALID);

         break;

   /* case PNG_FP_EXPONEXT + PNG_FP_SAW_E:
         goto PNG_FP_End; */

      default: goto PNG_FP_End; /* I.e. break 2 */
      }

      /* The character seems ok, continue. */
      ++i;
   }

PNG_FP_End:
   /* Here at the end, update the state and return the correct
    * return code.
    */
   *statep = state;
   *whereami = i;

   return (state & PNG_FP_SAW_DIGIT) != 0;
}